

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O0

SQInteger sqstd_rex_parsenumber(SQRex *exp)

{
  char *pcVar1;
  int iVar2;
  SQRex *exp_00;
  long in_RDI;
  SQInteger positions;
  SQInteger ret;
  long lVar3;
  
  exp_00 = (SQRex *)(long)(**(char **)(in_RDI + 0x10) + -0x30);
  lVar3 = 10;
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
  while( true ) {
    iVar2 = isdigit((int)**(char **)(in_RDI + 0x10));
    if (iVar2 == 0) break;
    pcVar1 = *(char **)(in_RDI + 0x10);
    *(char **)(in_RDI + 0x10) = pcVar1 + 1;
    exp_00 = (SQRex *)((long)exp_00 * 10 + (long)(*pcVar1 + -0x30));
    if (lVar3 == 1000000000) {
      sqstd_rex_error(exp_00,(SQChar *)0x3b9aca00);
    }
    lVar3 = lVar3 * 10;
  }
  return (SQInteger)exp_00;
}

Assistant:

static SQInteger sqstd_rex_parsenumber(SQRex *exp)
{
    SQInteger ret = *exp->_p-'0';
    SQInteger positions = 10;
    exp->_p++;
    while(isdigit(*exp->_p)) {
        ret = ret*10+(*exp->_p++-'0');
        if(positions==1000000000) sqstd_rex_error(exp,_SC("overflow in numeric constant"));
        positions *= 10;
    };
    return ret;
}